

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::_q_enterInteractiveMode(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  LayoutDirection LVar6;
  int iVar7;
  Representation RVar8;
  QObject *pQVar9;
  QStyle *pQVar10;
  QPoint QVar11;
  byte bVar12;
  QObject *pQVar13;
  Representation RVar14;
  long in_FS_OFFSET;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::sender();
  pQVar9 = (QObject *)QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (pQVar9 == (QObject *)0x0) goto LAB_0044ae1e;
  local_38.xp.m_i = 0;
  local_38.yp.m_i = 0;
  pDVar1 = this->actions[1].wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     (pQVar13 = this->actions[1].wp.value, pQVar13 == (QObject *)0x0 || *(int *)(pDVar1 + 4) == 0))
  {
LAB_0044ac72:
    pDVar1 = this->actions[2].wp.d;
    if ((pDVar1 == (Data *)0x0) ||
       (pQVar13 = this->actions[2].wp.value, pQVar13 == (QObject *)0x0 || *(int *)(pDVar1 + 4) == 0)
       ) goto LAB_0044ae1e;
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar13 = (QObject *)0x0;
    }
    if (pQVar13 != pQVar9) goto LAB_0044ae1e;
    LVar6 = QWidget::layoutDirection(this_00);
    this->currentOperation = (LVar6 == LeftToRight) + BottomLeftResize;
    pQVar10 = QWidget::style(this_00);
    iVar7 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x2c,0,this_00);
    iVar7 = iVar7 / 2;
    LVar6 = QWidget::layoutDirection(this_00);
    pQVar2 = this_00->data;
    RVar14.m_i = iVar7;
    if (LVar6 == LeftToRight) {
      RVar14.m_i = ((pQVar2->crect).x2.m_i - ((pQVar2->crect).x1.m_i + iVar7)) + 1;
    }
    RVar8.m_i = ((pQVar2->crect).y2.m_i - (iVar7 + (pQVar2->crect).y1.m_i)) + 1;
  }
  else {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar13 = (QObject *)0x0;
    }
    if (pQVar13 != pQVar9) goto LAB_0044ac72;
    this->currentOperation = Move;
    iVar7 = (this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i;
    RVar14.m_i = (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1;
    iVar7 = titleBarHeight(this);
    RVar8.m_i = iVar7 + -1;
  }
  local_38.yp.m_i = RVar8.m_i;
  local_38.xp.m_i = RVar14.m_i;
  updateCursor(this);
  QWidget::cursor((QWidget *)&stack0xffffffffffffffc0);
  QVar11 = QWidget::mapToGlobal(this_00,&local_38);
  QCursor::setPos(QVar11.xp.m_i.m_i,QVar11.yp.m_i.m_i);
  QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
  QVar11 = QWidget::mapToParent(this_00,&local_38);
  this->mousePressPosition = QVar11;
  pQVar2 = this_00->data;
  RVar3.m_i = (pQVar2->crect).y1.m_i;
  RVar4.m_i = (pQVar2->crect).x2.m_i;
  RVar5.m_i = (pQVar2->crect).y2.m_i;
  (this->oldGeometry).x1 = (Representation)(pQVar2->crect).x1.m_i;
  (this->oldGeometry).y1 = (Representation)RVar3.m_i;
  (this->oldGeometry).x2 = (Representation)RVar4.m_i;
  (this->oldGeometry).y2 = (Representation)RVar5.m_i;
  this->isInInteractiveMode = true;
  QWidget::setFocus(this_00,OtherFocusReason);
  bVar12 = (byte)*(undefined4 *)(*(long *)&this_00->field_0x8 + 0x388);
  if (((bVar12 >> 2 & (this->currentOperation & ~Move) == BottomLeftResize) == 0) &&
     ((this->currentOperation == Move & bVar12 >> 3) != 1)) {
    QWidget::grabMouse(this_00);
  }
  else {
    enterRubberBandMode(this);
  }
LAB_0044ae1e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::_q_enterInteractiveMode()
{
#ifndef QT_NO_ACTION
    Q_Q(QMdiSubWindow);
    QAction *action = qobject_cast<QAction *>(q->sender());
    if (!action)
        return;

    QPoint pressPos;
    if (actions[MoveAction] && actions[MoveAction] == action) {
        currentOperation = Move;
        pressPos = QPoint(q->width() / 2, titleBarHeight() - 1);
    } else if (actions[ResizeAction] && actions[ResizeAction] == action) {
        currentOperation = q->isLeftToRight() ? BottomRightResize : BottomLeftResize;
        int offset = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q) / 2;
        int x = q->isLeftToRight() ? q->width() - offset : offset;
        pressPos = QPoint(x, q->height() - offset);
    } else {
        return;
    }

    updateCursor();
#ifndef QT_NO_CURSOR
    q->cursor().setPos(q->mapToGlobal(pressPos));
#endif
    mousePressPosition = q->mapToParent(pressPos);
    oldGeometry = q->geometry();
    isInInteractiveMode = true;
    q->setFocus();
#if QT_CONFIG(rubberband)
    if ((q->testOption(QMdiSubWindow::RubberBandResize)
            && (currentOperation == BottomRightResize || currentOperation == BottomLeftResize))
            || (q->testOption(QMdiSubWindow::RubberBandMove) && currentOperation == Move)) {
        enterRubberBandMode();
    } else
#endif // QT_CONFIG(rubberband)
    {
        q->grabMouse();
    }
#endif // QT_NO_ACTION
}